

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall xercesc_4_0::AbstractDOMParser::doctypePI(AbstractDOMParser *this)

{
  XMLCh *in_RDX;
  XMLCh *in_RSI;
  
  doctypePI((AbstractDOMParser *)&this[-1].fBufMgr.fBufList,in_RSI,in_RDX);
  return;
}

Assistant:

void AbstractDOMParser::doctypePI
(
    const   XMLCh* const    target
    , const XMLCh* const    data
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        //add these chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chQuestion);
        fInternalSubset.append(target);
        fInternalSubset.append(chSpace);
        fInternalSubset.append(data);
        fInternalSubset.append(chQuestion);
        fInternalSubset.append(chCloseAngle);
    }
}